

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Tanh::forward_impl
          (Tanh *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  PointerType pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  float fVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_68;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  Tensor::operator*(&local_48,
                    *(xs->
                     super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  Tensor::operator*(&local_68,fx);
  if ((local_68.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value ==
       local_48.
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value) &&
     (local_68.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value ==
      local_48.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value)) {
    uVar20 = local_68.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value *
             local_68.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_rows.m_value;
    uVar23 = uVar20;
    if ((((ulong)local_68.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data & 3) == 0) &&
       (uVar23 = (ulong)(-((uint)((ulong)local_68.
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                         .
                                         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                         .m_data >> 2) & 0x3fffffff) & 0xf),
       (long)uVar20 <= (long)uVar23)) {
      uVar23 = uVar20;
    }
    uVar24 = uVar20 - uVar23;
    uVar21 = uVar24 + 0xf;
    if (-1 < (long)uVar24) {
      uVar21 = uVar24;
    }
    if (0 < (long)uVar23) {
      uVar25 = 0;
      do {
        auVar18 = vminss_avx(SUB6416(ZEXT464(0x40fff644),0),
                             ZEXT416((uint)local_48.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_data[uVar25]));
        auVar18 = vmaxss_avx(auVar18,SUB6416(ZEXT464(0xc0fff644),0));
        fVar46 = auVar18._0_4_;
        fVar19 = fVar46 * fVar46;
        auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xa59f25c0),0),ZEXT416((uint)fVar19),
                                  SUB6416(ZEXT464(0x2a61337e),0));
        auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar19),SUB6416(ZEXT464(0xaebd37ff),0));
        auVar47 = ZEXT416((uint)fVar19);
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x335c0041),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3779434a),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3a270ded),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3ba059dc),0));
        auVar48 = ZEXT416((uint)fVar19);
        auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0x35a0d3d8),0),auVar48,
                                  SUB6416(ZEXT464(0x38f895d6),0));
        auVar47 = vfmadd213ss_fma(auVar47,auVar48,SUB6416(ZEXT464(0x3b14aa05),0));
        auVar47 = vfmadd213ss_fma(auVar47,auVar48,SUB6416(ZEXT464(0x3ba059dd),0));
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[uVar25] = (auVar18._0_4_ * fVar46) / auVar47._0_4_;
        uVar25 = uVar25 + 1;
      } while (uVar23 != uVar25);
    }
    lVar22 = (uVar21 & 0xfffffffffffffff0) + uVar23;
    if (0xf < (long)uVar24) {
      auVar26 = vbroadcastss_avx512f(ZEXT416(0x40fff644));
      auVar27 = vbroadcastss_avx512f(ZEXT416(0xc0fff644));
      auVar28 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar29 = vbroadcastss_avx512f(ZEXT416(0x39d1b717));
      auVar30 = vbroadcastss_avx512f(ZEXT416(0xa59f25c0));
      auVar31 = vbroadcastss_avx512f(ZEXT416(0x2a61337e));
      auVar32 = vbroadcastss_avx512f(ZEXT416(0xaebd37ff));
      auVar33 = vbroadcastss_avx512f(ZEXT416(0x335c0041));
      auVar34 = vbroadcastss_avx512f(ZEXT416(0x3779434a));
      auVar35 = vbroadcastss_avx512f(ZEXT416(0x3a270ded));
      auVar36 = vbroadcastss_avx512f(ZEXT416(0x3ba059dc));
      auVar37 = vbroadcastss_avx512f(ZEXT416(0x35a0d3d8));
      auVar38 = vbroadcastss_avx512f(ZEXT416(0x38f895d6));
      auVar39 = vbroadcastss_avx512f(ZEXT416(0x3b14aa05));
      auVar40 = vbroadcastss_avx512f(ZEXT416(0x3ba059dd));
      do {
        auVar41 = vminps_avx512f(*(undefined1 (*) [64])
                                  (local_48.
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                   .
                                   super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                   .m_data + uVar23),auVar26);
        auVar41 = vmaxps_avx512f(auVar41,auVar27);
        auVar42 = vandps_avx512dq(*(undefined1 (*) [64])
                                   (local_48.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_data + uVar23),auVar28);
        uVar21 = vcmpps_avx512f(auVar42,auVar29,0xd);
        auVar42 = vmulps_avx512f(auVar41,auVar41);
        auVar43 = vfmadd213ps_avx512f(auVar30,auVar42,auVar31);
        auVar43 = vfmadd213ps_avx512f(auVar43,auVar42,auVar32);
        auVar43 = vfmadd213ps_avx512f(auVar43,auVar42,auVar33);
        auVar43 = vfmadd213ps_avx512f(auVar43,auVar42,auVar34);
        auVar43 = vfmadd213ps_avx512f(auVar43,auVar42,auVar35);
        auVar43 = vfmadd213ps_avx512f(auVar43,auVar42,auVar36);
        auVar43 = vmulps_avx512f(auVar43,auVar41);
        auVar44 = vfmadd213ps_avx512f(auVar37,auVar42,auVar38);
        auVar44 = vfmadd213ps_avx512f(auVar44,auVar42,auVar39);
        auVar42 = vfmadd213ps_avx512f(auVar44,auVar42,auVar40);
        auVar44 = vrcp14ps_avx512f(auVar42);
        auVar45 = vmulps_avx512f(auVar43,auVar44);
        auVar42 = vfmsub213ps_avx512f(auVar42,auVar45,auVar43);
        auVar42 = vfnmadd213ps_avx512f(auVar42,auVar44,auVar45);
        bVar2 = (bool)((byte)uVar21 & 1);
        bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar21 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar21 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 7) & 1);
        bVar10 = (bool)((byte)(uVar21 >> 8) & 1);
        bVar11 = (bool)((byte)(uVar21 >> 9) & 1);
        bVar12 = (bool)((byte)(uVar21 >> 10) & 1);
        bVar13 = (bool)((byte)(uVar21 >> 0xb) & 1);
        bVar14 = (bool)((byte)(uVar21 >> 0xc) & 1);
        bVar15 = (bool)((byte)(uVar21 >> 0xd) & 1);
        bVar16 = (bool)((byte)(uVar21 >> 0xe) & 1);
        bVar17 = SUB81(uVar21 >> 0xf,0);
        pfVar1 = local_68.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data + uVar23;
        *pfVar1 = (float)((uint)bVar2 * auVar42._0_4_ | (uint)!bVar2 * auVar41._0_4_);
        pfVar1[1] = (float)((uint)bVar3 * auVar42._4_4_ | (uint)!bVar3 * auVar41._4_4_);
        pfVar1[2] = (float)((uint)bVar4 * auVar42._8_4_ | (uint)!bVar4 * auVar41._8_4_);
        pfVar1[3] = (float)((uint)bVar5 * auVar42._12_4_ | (uint)!bVar5 * auVar41._12_4_);
        pfVar1[4] = (float)((uint)bVar6 * auVar42._16_4_ | (uint)!bVar6 * auVar41._16_4_);
        pfVar1[5] = (float)((uint)bVar7 * auVar42._20_4_ | (uint)!bVar7 * auVar41._20_4_);
        pfVar1[6] = (float)((uint)bVar8 * auVar42._24_4_ | (uint)!bVar8 * auVar41._24_4_);
        pfVar1[7] = (float)((uint)bVar9 * auVar42._28_4_ | (uint)!bVar9 * auVar41._28_4_);
        pfVar1[8] = (float)((uint)bVar10 * auVar42._32_4_ | (uint)!bVar10 * auVar41._32_4_);
        pfVar1[9] = (float)((uint)bVar11 * auVar42._36_4_ | (uint)!bVar11 * auVar41._36_4_);
        pfVar1[10] = (float)((uint)bVar12 * auVar42._40_4_ | (uint)!bVar12 * auVar41._40_4_);
        pfVar1[0xb] = (float)((uint)bVar13 * auVar42._44_4_ | (uint)!bVar13 * auVar41._44_4_);
        pfVar1[0xc] = (float)((uint)bVar14 * auVar42._48_4_ | (uint)!bVar14 * auVar41._48_4_);
        pfVar1[0xd] = (float)((uint)bVar15 * auVar42._52_4_ | (uint)!bVar15 * auVar41._52_4_);
        pfVar1[0xe] = (float)((uint)bVar16 * auVar42._56_4_ | (uint)!bVar16 * auVar41._56_4_);
        pfVar1[0xf] = (float)((uint)bVar17 * auVar42._60_4_ | (uint)!bVar17 * auVar41._60_4_);
        uVar23 = uVar23 + 0x10;
      } while ((long)uVar23 < lVar22);
    }
    if (lVar22 < (long)uVar20) {
      do {
        auVar18 = vminss_avx(SUB6416(ZEXT464(0x40fff644),0),
                             ZEXT416((uint)local_48.
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                           .
                                           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                           .m_data[lVar22]));
        auVar18 = vmaxss_avx(auVar18,SUB6416(ZEXT464(0xc0fff644),0));
        fVar46 = auVar18._0_4_;
        fVar19 = fVar46 * fVar46;
        auVar18 = vfmadd213ss_fma(SUB6416(ZEXT464(0xa59f25c0),0),ZEXT416((uint)fVar19),
                                  SUB6416(ZEXT464(0x2a61337e),0));
        auVar18 = vfmadd213ss_fma(auVar18,ZEXT416((uint)fVar19),SUB6416(ZEXT464(0xaebd37ff),0));
        auVar47 = ZEXT416((uint)fVar19);
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x335c0041),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3779434a),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3a270ded),0));
        auVar18 = vfmadd213ss_fma(auVar18,auVar47,SUB6416(ZEXT464(0x3ba059dc),0));
        auVar48 = ZEXT416((uint)fVar19);
        auVar47 = vfmadd213ss_fma(SUB6416(ZEXT464(0x35a0d3d8),0),auVar48,
                                  SUB6416(ZEXT464(0x38f895d6),0));
        auVar47 = vfmadd213ss_fma(auVar47,auVar48,SUB6416(ZEXT464(0x3b14aa05),0));
        auVar47 = vfmadd213ss_fma(auVar47,auVar48,SUB6416(ZEXT464(0x3ba059dd),0));
        local_68.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_data[lVar22] = (auVar18._0_4_ * fVar46) / auVar47._0_4_;
        lVar22 = lVar22 + 1;
      } while (uVar20 - lVar22 != 0);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
               );
}

Assistant:

void Tanh::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#if HAVE_CUDA
  gpu::vtanh(fx.d.size(), xs[0]->v, fx.v);
#else
  auto x = **xs[0];
  (*fx).array() = x.array().tanh();
#endif
}